

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.c
# Opt level: O3

_Bool PolygonDestroy(Polygon *polygon)

{
  if (polygon == (Polygon *)0x0) {
    PolygonDestroy_cold_1();
  }
  else {
    free(polygon->triangles);
    free(polygon);
  }
  return polygon != (Polygon *)0x0;
}

Assistant:

bool PolygonDestroy(Polygon *polygon) {
  if (polygon == NULL) {
#ifndef NDEBUG
    fprintf(stderr, "%s: trying to free null pointer, ignored.\n", __FUNCTION_NAME__);
#endif
    return false;
  }
  free(polygon->triangles);
  free(polygon);
  return true;
}